

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool scan_bare_dollar(TSLexer *lexer)

{
  _Bool _Var1;
  int iVar2;
  _Bool local_1a;
  byte local_19;
  TSLexer *lexer_local;
  
  while( true ) {
    iVar2 = iswspace(lexer->lookahead);
    local_19 = 0;
    if (iVar2 != 0) {
      local_19 = 0;
      if (lexer->lookahead != 10) {
        _Var1 = (*lexer->eof)(lexer);
        local_19 = _Var1 ^ 0xff;
      }
    }
    if ((local_19 & 1) == 0) break;
    skip(lexer);
  }
  if (lexer->lookahead == 0x24) {
    advance(lexer);
    lexer->result_symbol = 0xf;
    (*lexer->mark_end)(lexer);
    iVar2 = iswspace(lexer->lookahead);
    local_1a = true;
    if (iVar2 == 0) {
      _Var1 = (*lexer->eof)(lexer);
      local_1a = true;
      if (!_Var1) {
        local_1a = lexer->lookahead == 0x22;
      }
    }
    lexer_local._7_1_ = local_1a;
  }
  else {
    lexer_local._7_1_ = false;
  }
  return lexer_local._7_1_;
}

Assistant:

static inline bool scan_bare_dollar(TSLexer *lexer) {
    while (iswspace(lexer->lookahead) && lexer->lookahead != '\n' && !lexer->eof(lexer)) {
        skip(lexer);
    }

    if (lexer->lookahead == '$') {
        advance(lexer);
        lexer->result_symbol = BARE_DOLLAR;
        lexer->mark_end(lexer);
        return iswspace(lexer->lookahead) || lexer->eof(lexer) || lexer->lookahead == '\"';
    }

    return false;
}